

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  string *name;
  bool bVar1;
  char *__nptr;
  ulong uVar2;
  string_view local_50;
  string_view local_40;
  string *local_30;
  string *s;
  string *var;
  int i;
  int nMatches;
  cmValue nMatchesStr;
  cmMakefile *this_local;
  
  nMatchesStr.Value = (string *)this;
  _i = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&i);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_((cmValue *)&i);
    __nptr = (char *)std::__cxx11::string::c_str();
    var._4_4_ = atoi(__nptr);
    for (var._0_4_ = 0; (int)var <= var._4_4_; var._0_4_ = (int)var + 1) {
      s = matchVariables_abi_cxx11_ + (int)var;
      local_30 = GetSafeDefinition(this,s);
      uVar2 = std::__cxx11::string::empty();
      name = s;
      if ((uVar2 & 1) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"");
        AddDefinition(this,name,local_40);
        MarkVariableAsUsed(this,s);
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"0");
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,local_50);
    MarkVariableAsUsed(this,&nMatchesVariable_abi_cxx11_);
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  cmValue nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr->c_str());
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}